

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintBool_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,bool val)

{
  char *pcVar1;
  allocator local_1a;
  undefined1 local_19;
  FieldValuePrinter *pFStack_18;
  bool val_local;
  FieldValuePrinter *this_local;
  
  pcVar1 = "false";
  if (val) {
    pcVar1 = "true";
  }
  local_19 = val;
  pFStack_18 = this;
  this_local = (FieldValuePrinter *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  return __return_storage_ptr__;
}

Assistant:

string TextFormat::FieldValuePrinter::PrintBool(bool val) const {
  return val ? "true" : "false";
}